

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmOutputConverter *this_00;
  cmMakefile *pcVar1;
  char *pcVar2;
  string *this_01;
  pointer source;
  string modflag;
  string mod_dir;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string((string *)&mod_dir,"CMAKE_Fortran_MODOUT_FLAG",(allocator *)&modflag)
  ;
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&mod_dir);
  std::__cxx11::string::~string((string *)&mod_dir);
  if (pcVar2 != (char *)0x0) {
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(this,__return_storage_ptr__,pcVar2);
  }
  cmGeneratorTarget::GetFortranModuleDirectory(&mod_dir,target,&this->WorkingDirectory);
  if (mod_dir._M_string_length == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string
              ((string *)&modflag,"CMAKE_Fortran_MODDIR_DEFAULT",(allocator *)&local_68);
    cmMakefile::GetSafeDefinition(pcVar1,&modflag);
    std::__cxx11::string::assign((char *)&mod_dir);
    this_01 = &modflag;
  }
  else {
    this_00 = &(this->super_cmLocalGenerator).super_cmOutputConverter;
    cmOutputConverter::ConvertToRelativePath(&local_68,this_00,&this->WorkingDirectory,&mod_dir);
    cmOutputConverter::ConvertToOutputFormat(&modflag,this_00,&local_68,SHELL);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&modflag);
    std::__cxx11::string::~string((string *)&modflag);
    this_01 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_01);
  if (mod_dir._M_string_length != 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string
              ((string *)&modflag,"CMAKE_Fortran_MODDIR_FLAG",(allocator *)&local_68);
    pcVar2 = cmMakefile::GetRequiredDefinition(pcVar1,&modflag);
    std::__cxx11::string::~string((string *)&modflag);
    std::__cxx11::string::string((string *)&modflag,pcVar2,(allocator *)&local_68);
    std::__cxx11::string::append((string *)&modflag);
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this,__return_storage_ptr__,&modflag);
    std::__cxx11::string::~string((string *)&modflag);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string
            ((string *)&modflag,"CMAKE_Fortran_MODPATH_FLAG",(allocator *)&local_68);
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&modflag);
  std::__cxx11::string::~string((string *)&modflag);
  if (pcVar2 != (char *)0x0) {
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&modflag,"C",(allocator *)&local_68);
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,&includes,target,&modflag,config,true);
    std::__cxx11::string::~string((string *)&modflag);
    for (source = includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        source != includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
      std::__cxx11::string::string((string *)&modflag,pcVar2,(allocator *)&local_68);
      cmOutputConverter::ConvertToOutputFormat
                (&local_68,&(this->super_cmLocalGenerator).super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::append((string *)&modflag);
      std::__cxx11::string::~string((string *)&local_68);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,&modflag);
      std::__cxx11::string::~string((string *)&modflag);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
  }
  std::__cxx11::string::~string((string *)&mod_dir);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  if (const char* modout_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG")) {
    this->AppendFlags(flags, modout_flag);
  }

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->WorkingDirectory);
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->ConvertToRelativePath(this->WorkingDirectory, mod_dir),
      cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    const char* moddir_flag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    std::string modflag = moddir_flag;
    modflag += mod_dir;
    this->AppendFlags(flags, modflag);
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (const char* modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::vector<std::string>::const_iterator idi = includes.begin();
         idi != includes.end(); ++idi) {
      std::string flg = modpath_flag;
      flg += this->ConvertToOutputFormat(*idi, cmOutputConverter::SHELL);
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}